

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isPossibleParameter(TokenKind kind)

{
  bool bVar1;
  int iVar2;
  undefined6 in_register_0000003a;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,kind);
  if (iVar2 < 0xea) {
    if ((iVar2 == 0x18) || (iVar2 == 0xd2)) {
      return true;
    }
  }
  else {
    if (iVar2 == 0xea) {
      return true;
    }
    if (iVar2 == 0x138) {
      return true;
    }
  }
  bVar1 = isPossibleDataType(kind);
  return bVar1;
}

Assistant:

bool SyntaxFacts::isPossibleParameter(TokenKind kind) {
    switch (kind) {
        case TokenKind::ParameterKeyword:
        case TokenKind::LocalParamKeyword:
        case TokenKind::TypeKeyword:
        case TokenKind::Comma:
            return true;
        default:
            return isPossibleDataType(kind);
    }
}